

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O1

void __thiscall CVmImageWriter::write_meta_dep_item(CVmImageWriter *this,char *metaclass_name)

{
  CVmFile *pCVar1;
  undefined8 in_RAX;
  long lVar2;
  char b [2];
  char b_1 [2];
  char b_2 [2];
  undefined1 auStack_28 [4];
  char local_24 [2];
  undefined2 local_22;
  
  _auStack_28 = in_RAX;
  end_meta_prop_list(this);
  pCVar1 = this->fp_;
  lVar2 = ftell((FILE *)pCVar1->fp_);
  this->mcld_ofs_pos_ = lVar2 - pCVar1->seek_base_;
  auStack_28 = (undefined1  [4])CONCAT22(0,auStack_28._0_2_);
  CVmFile::write_bytes(this->fp_,auStack_28 + 2,2);
  write_dep_block_item(this,metaclass_name);
  pCVar1 = this->fp_;
  lVar2 = ftell((FILE *)pCVar1->fp_);
  this->mcld_propcnt_pos_ = lVar2 - pCVar1->seek_base_;
  _auStack_28 = (uint6)(uint)auStack_28;
  CVmFile::write_bytes(this->fp_,auStack_28 + 4,2);
  _auStack_28 = CONCAT26(2,_auStack_28);
  CVmFile::write_bytes(this->fp_,auStack_28 + 6,2);
  this->mcld_prop_cnt_ = 0;
  return;
}

Assistant:

void CVmImageWriter::write_meta_dep_item(const char *metaclass_name)
{
    /* if we didn't end the previous item's property list, end it now */
    end_meta_prop_list();

    /* write a placeholder next record offset */
    mcld_ofs_pos_ = fp_->get_pos();
    fp_->write_uint2(0);
    
    /* write the metaclass name */
    write_dep_block_item(metaclass_name);

    /* write a placeholder property vector count */
    mcld_propcnt_pos_ = fp_->get_pos();
    fp_->write_uint2(0);

    /* write the property record size (2 bytes) */
    fp_->write_uint2(2);

    /* no properties yet */
    mcld_prop_cnt_ = 0;
}